

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

string_t * __thiscall
pugi::xpath_query::evaluate_string_abi_cxx11_
          (string_t *__return_storage_ptr__,xpath_query *this,xpath_node *n)

{
  undefined8 *puVar1;
  xpath_string r;
  xpath_context c;
  xpath_stack_data sd;
  xpath_string local_20b0;
  xpath_context local_2098;
  xpath_stack_data local_2078;
  
  if ((undefined8 *)this->_impl == (undefined8 *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_2098.n._node._root = (n->_node)._root;
    local_2098.n._attribute._attr = (n->_attribute)._attr;
    local_2098.position = 1;
    local_2098.size = 1;
    local_2078.stack.result = &local_2078.result;
    local_2078.result._error = &local_2078.oom;
    local_2078.result._root = local_2078.blocks;
    local_2078.result._root_size = 0;
    local_2078.stack.temp = &local_2078.temp;
    local_2078.temp._root = local_2078.blocks + 1;
    local_2078.temp._root_size = 0;
    local_2078.oom = false;
    local_2078.blocks[1].next = (xpath_memory_block *)0x0;
    local_2078.blocks[0].next = (xpath_memory_block *)0x0;
    local_2078.blocks[1].capacity = 0x1000;
    local_2078.blocks[0].capacity = 0x1000;
    local_2078.temp._error = local_2078.result._error;
    impl::anon_unknown_0::xpath_ast_node::eval_string
              (&local_20b0,*this->_impl,&local_2098,&local_2078.stack);
    if (local_2078.oom == true) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = std::thread::_M_start_thread;
      __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    if (local_20b0._uses_heap != true) {
      local_20b0._length_heap = strlen(local_20b0._buffer);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_20b0._buffer,
               local_20b0._buffer + local_20b0._length_heap);
    impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data(&local_2078);
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI_IMPL_FN string_t xpath_query::evaluate_string(const xpath_node& n) const
	{
		if (!_impl) return string_t();

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		impl::xpath_string r = static_cast<impl::xpath_query_impl*>(_impl)->root->eval_string(c, sd.stack);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return string_t();
		#else
			throw std::bad_alloc();
		#endif
		}

		return string_t(r.c_str(), r.length());
	}